

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGenerator::AddGlobalTarget_PackageSource
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  string *psVar5;
  cmCustomCommandLine singleLine;
  string configFile;
  GlobalTargetInfo gti;
  string local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  string local_e8;
  undefined1 local_c8 [112];
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  bool local_38;
  char *__s;
  
  iVar4 = (*this->_vptr_cmGlobalGenerator[0x1e])();
  __s = (char *)CONCAT44(extraout_var,iVar4);
  if (__s != (char *)0x0) {
    this_00 = *(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    pcVar2 = (psVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar2,pcVar2 + psVar5->_M_string_length);
    std::__cxx11::string::append((char *)&local_e8);
    bVar3 = cmsys::SystemTools::FileExists(&local_e8);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_c8,"package_source",(allocator<char> *)&local_108);
      paVar1 = &local_128.field_2;
      local_128._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_128,"when CPack source packaging is enabled","");
      bVar3 = CheckCMP0037(this,(string *)local_c8,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar1) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
        operator_delete((void *)local_c8._0_8_,CONCAT71(local_c8._17_7_,local_c8[0x10]) + 1);
      }
      if (bVar3) {
        local_c8._0_8_ = local_c8 + 0x10;
        local_c8._8_8_ = 0;
        local_c8[0x10] = '\0';
        local_c8._40_8_ = (char *)0x0;
        local_c8[0x30] = '\0';
        local_c8._64_8_ = (pointer)0x0;
        local_c8._72_8_ = (pointer)0x0;
        local_c8._80_8_ = (pointer)0x0;
        local_c8._88_8_ = (pointer)0x0;
        local_c8._96_8_ = (pointer)0x0;
        local_c8._104_8_ = (pointer)0x0;
        local_50 = 0;
        local_48._M_local_buf[0] = '\0';
        local_38 = false;
        local_c8._32_8_ = local_c8 + 0x30;
        local_58._M_p = (pointer)&local_48;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)local_c8,0,(char *)0x0,(ulong)__s);
        std::__cxx11::string::_M_replace
                  ((ulong)(local_c8 + 0x20),0,(char *)local_c8._40_8_,0x4d5ab3);
        cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
        std::__cxx11::string::_M_assign((string *)&local_58);
        local_38 = true;
        local_108.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_108.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_108.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        psVar5 = cmSystemTools::GetCPackCommand_abi_cxx11_();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_108,psVar5);
        local_128._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"--config","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
                   &local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != paVar1) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        local_128._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_128,"./CPackSourceConfig.cmake","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
                   &local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != paVar1) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
                   &local_e8);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
        emplace_back<cmCustomCommandLine>
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                   (local_c8 + 0x40),(cmCustomCommandLine *)&local_108);
        std::
        vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
        ::emplace_back<cmGlobalGenerator::GlobalTargetInfo>(targets,(GlobalTargetInfo *)local_c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_p != &local_48) {
          operator_delete(local_58._M_p,
                          CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) +
                          1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_c8 + 0x58));
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                   (local_c8 + 0x40));
        if ((undefined1 *)local_c8._32_8_ != local_c8 + 0x30) {
          operator_delete((void *)local_c8._32_8_,CONCAT71(local_c8._49_7_,local_c8[0x30]) + 1);
        }
        if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
          operator_delete((void *)local_c8._0_8_,CONCAT71(local_c8._17_7_,local_c8[0x10]) + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_PackageSource(
  std::vector<GlobalTargetInfo>& targets)
{
  const char* packageSourceTargetName = this->GetPackageSourceTargetName();
  if (!packageSourceTargetName) {
    return;
  }

  cmMakefile* mf = this->Makefiles[0];
  std::string configFile = mf->GetCurrentBinaryDirectory();
  configFile += "/CPackSourceConfig.cmake";
  if (!cmSystemTools::FileExists(configFile)) {
    return;
  }

  static const auto reservedTargets = { "package_source" };
  for (auto const& target : reservedTargets) {
    if (!this->CheckCMP0037(target,
                            "when CPack source packaging is enabled")) {
      return;
    }
  }

  GlobalTargetInfo gti;
  gti.Name = packageSourceTargetName;
  gti.Message = "Run CPack packaging tool for source...";
  gti.WorkingDir = mf->GetCurrentBinaryDirectory();
  gti.UsesTerminal = true;
  cmCustomCommandLine singleLine;
  singleLine.push_back(cmSystemTools::GetCPackCommand());
  singleLine.push_back("--config");
  singleLine.push_back("./CPackSourceConfig.cmake");
  singleLine.push_back(std::move(configFile));
  gti.CommandLines.push_back(std::move(singleLine));
  targets.push_back(std::move(gti));
}